

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenReader
          (string *__return_storage_ptr__,SwiftGenerator *this,string *type,string *at)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"{{ACCESS}}.readBuffer(of: {{",type);
  std::operator+(&bStack_78,&local_38,"}}.self, at: ");
  std::operator+(&local_58,&bStack_78,at);
  std::operator+(__return_storage_ptr__,&local_58,")");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GenReader(const std::string &type,
                        const std::string &at = "{{OFFSET}}") {
    return "{{ACCESS}}.readBuffer(of: {{" + type + "}}.self, at: " + at + ")";
  }